

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O2

void get_str(char **pt,char *kvalue,unsigned_long *stat)

{
  char *pcVar1;
  char cVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  size_t __n;
  char *pcVar7;
  bool bVar8;
  
  pcVar7 = *pt;
  pcVar1 = pcVar7 + 1;
  cVar5 = 'a';
  uVar6 = 0xffffffff;
  while( true ) {
    cVar2 = pcVar7[1];
    if ((long)cVar2 == 0) break;
    ppuVar3 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar3 + (long)cVar2 * 2 + 1) & 0x40) == 0) {
      *(byte *)stat = (byte)*stat | 1;
    }
    bVar8 = cVar5 == '\'';
    cVar5 = pcVar7[1];
    if ((bVar8) && (bVar8 = cVar5 != '\'', cVar5 = 'a', bVar8)) break;
    pcVar7 = pcVar7 + 1;
    uVar6 = uVar6 + 1;
  }
  if (*pcVar7 != '\'') {
    *(byte *)stat = (byte)*stat | 2;
  }
  __n = 0;
  if (0 < (int)uVar6) {
    __n = (size_t)uVar6;
  }
  strncpy(kvalue,pcVar1,__n);
  ppuVar3 = __ctype_b_loc();
  pcVar1 = kvalue + __n;
  do {
    pcVar4 = pcVar1 + -1;
    *pcVar1 = '\0';
    if (pcVar4 < kvalue) break;
    pcVar1 = pcVar4;
  } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
  do {
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    if ((long)*pcVar1 == 0) break;
  } while (((*ppuVar3)[*pcVar1] & 0x2000) != 0);
  *pt = pcVar7;
  return;
}

Assistant:

void get_str(char **pt,     		/* card string from character 11*/
	    char *kvalue,		/* key value string */
	    unsigned long *stat		/* error number */
	   )
{    
    char *pi;
    char prev;		/* previous char */
    int nchar = 0;
    char *p;
  
    p = *pt;
    pi = p;
    p++;
    prev = 'a';
    while(*p != '\0') { 
        if( !isprint((int)*p) )*stat |= BAD_STR;
	if(prev == '\'' && *p != '\'') break;
	if(prev == '\'' && *p == '\'') {    /* skip the '' */
	    p++;
	    prev = 'a';
        } 
	else {
            prev = *p;
            p++;
        }
    }
    p--;
    if(*p != '\'') *stat |= NO_TRAIL_QUOTE; 
    pi++;	    
    nchar = p - pi ;     /* excluding the ' */
    if (nchar < 0) nchar = 0; 
    strncpy(kvalue,pi,(size_t)nchar);
    *(kvalue+nchar) = '\0'; 
    pi = kvalue + (nchar -1) ; 
    while(pi >= kvalue && isspace((int)*pi)){ *pi = '\0'; pi--;} /* delete the trailing space */ 
    p++;				  /* skip the  ' */
    while(isspace((int)*p) && *p != '\0')  p++; 
    *pt = p;
    return;
}